

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

Expected<const_llvm::DWARFDebugLine::LineTable_*> __thiscall
llvm::DWARFContext::getLineTableForUnit
          (DWARFContext *this,DWARFUnit *U,function<void_(llvm::Error)> *RecoverableErrorCallback)

{
  _Rb_tree_header *p_Var1;
  DIContextKind *pDVar2;
  DWARFObject *pDVar3;
  long *plVar4;
  DWARFDataExtractor *DebugLineData;
  pointer __p;
  SectionContribution *pSVar5;
  LineTable *pLVar6;
  function<void_(llvm::Error)> *in_RCX;
  DWARFUnit *extraout_RDX;
  DWARFUnit *pDVar7;
  DWARFUnit *extraout_RDX_00;
  DWARFUnit *extraout_RDX_01;
  ulong uVar8;
  DWARFContext *Ctx;
  Optional<unsigned_long> OVar9;
  Expected<const_llvm::DWARFDebugLine::LineTable_*> EVar10;
  undefined1 auStack_a8 [8];
  DWARFDataExtractor lineData;
  bool local_78;
  undefined1 local_70 [8];
  DWARFDie UnitDIE;
  code *local_50;
  
  if ((U->field_7).LocSection == (DWARFSection *)0x0) {
    __p = (pointer)operator_new(0x30);
    p_Var1 = &(__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::__uniq_ptr_impl<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>::reset
              ((__uniq_ptr_impl<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_> *)
               &(U->field_7).LocSectionData,__p);
  }
  DWARFUnit::extractDIEsIfNeeded((DWARFUnit *)RecoverableErrorCallback,true);
  UnitDIE.U = *(DWARFUnit **)
               ((long)&RecoverableErrorCallback[0xd].super__Function_base._M_functor + 8);
  pDVar7 = (DWARFUnit *)RecoverableErrorCallback;
  if (UnitDIE.U == (DWARFUnit *)RecoverableErrorCallback[0xd].super__Function_base._M_manager) {
    UnitDIE.U = (DWARFUnit *)0x0;
    pDVar7 = (DWARFUnit *)0x0;
  }
  if ((pDVar7 != (DWARFUnit *)0x0 && UnitDIE.U != (DWARFUnit *)0x0) &&
     (local_70 = (undefined1  [8])pDVar7,
     DWARFDie::find((Optional<llvm::DWARFFormValue> *)auStack_a8,(DWARFDie *)local_70,
                    DW_AT_stmt_list), pDVar7 = extraout_RDX, local_78 != false)) {
    OVar9 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)auStack_a8);
    pDVar7 = OVar9.Storage._8_8_;
    if (((undefined1  [16])OVar9.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if ((Entry *)RecoverableErrorCallback[1]._M_invoker == (Entry *)0x0) {
        uVar8 = 0;
      }
      else {
        pSVar5 = DWARFUnitIndex::Entry::getOffset
                           ((Entry *)RecoverableErrorCallback[1]._M_invoker,DW_SECT_LINE);
        if (pSVar5 == (SectionContribution *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)pSVar5->Offset;
        }
      }
      Ctx = (DWARFContext *)(uVar8 + OVar9.Storage.field_0.value);
      pLVar6 = DWARFDebugLine::getLineTable((DWARFDebugLine *)(U->field_7).LocSection,(uint64_t)Ctx)
      ;
      pDVar7 = extraout_RDX_00;
      if (pLVar6 != (LineTable *)0x0) {
        pDVar2 = &(this->super_DIContext).Kind;
        *(undefined1 *)pDVar2 = (char)*pDVar2 & 0xfe;
        (this->super_DIContext)._vptr_DIContext = (_func_int **)pLVar6;
        goto LAB_00ae1491;
      }
      pDVar3 = (DWARFObject *)RecoverableErrorCallback[4].super__Function_base._M_manager;
      if (Ctx < (DWARFContext *)(pDVar3->Dummy).Data.Data) {
        plVar4 = *(long **)((long)&(U->RngListTable).Storage.field_0 + 0x90);
        lineData.super_DataExtractor.Data.Length._0_1_ = (**(code **)(*plVar4 + 0x28))();
        lineData.super_DataExtractor.Data.Length._1_1_ =
             RecoverableErrorCallback[1].super__Function_base._M_functor._M_pod_data[2];
        auStack_a8 = (undefined1  [8])pDVar3->_vptr_DWARFObject;
        lineData.super_DataExtractor.Data.Data = (pDVar3->Dummy).Data.Data;
        DebugLineData = (DWARFDataExtractor *)(U->field_7).LocSection;
        lineData.super_DataExtractor._16_8_ = plVar4;
        lineData.Obj = pDVar3;
        std::function<void_(llvm::Error)>::function
                  ((function<void_(llvm::Error)> *)&UnitDIE.Die,in_RCX);
        EVar10 = DWARFDebugLine::getOrParseLineTable
                           ((DWARFDebugLine *)this,DebugLineData,(uint64_t)auStack_a8,Ctx,U,
                            RecoverableErrorCallback);
        pDVar7 = EVar10._8_8_;
        if (local_50 != (code *)0x0) {
          (*local_50)((_Any_data *)&UnitDIE.Die,(_Any_data *)&UnitDIE.Die,__destroy_functor);
          pDVar7 = extraout_RDX_01;
        }
        goto LAB_00ae1491;
      }
    }
  }
  pDVar2 = &(this->super_DIContext).Kind;
  *(undefined1 *)pDVar2 = (char)*pDVar2 & 0xfe;
  (this->super_DIContext)._vptr_DIContext = (_func_int **)0x0;
LAB_00ae1491:
  EVar10._8_8_ = pDVar7;
  EVar10.field_0 =
       (anon_union_8_2_427f0595_for_Expected<const_llvm::DWARFDebugLine::LineTable_*>_2)this;
  return EVar10;
}

Assistant:

Expected<const DWARFDebugLine::LineTable *> DWARFContext::getLineTableForUnit(
    DWARFUnit *U, std::function<void(Error)> RecoverableErrorCallback) {
  if (!Line)
    Line.reset(new DWARFDebugLine);

  auto UnitDIE = U->getUnitDIE();
  if (!UnitDIE)
    return nullptr;

  auto Offset = toSectionOffset(UnitDIE.find(DW_AT_stmt_list));
  if (!Offset)
    return nullptr; // No line table for this compile unit.

  uint64_t stmtOffset = *Offset + U->getLineTableOffset();
  // See if the line table is cached.
  if (const DWARFLineTable *lt = Line->getLineTable(stmtOffset))
    return lt;

  // Make sure the offset is good before we try to parse.
  if (stmtOffset >= U->getLineSection().Data.size())
    return nullptr;

  // We have to parse it first.
  DWARFDataExtractor lineData(*DObj, U->getLineSection(), isLittleEndian(),
                              U->getAddressByteSize());
  return Line->getOrParseLineTable(lineData, stmtOffset, *this, U,
                                   RecoverableErrorCallback);
}